

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  FILE *pFVar5;
  undefined8 in_RSI;
  byte bVar6;
  FILE *fp_1;
  FILE *fp;
  _Bool res;
  OpenJTalk *openjtalk;
  _Bool stdin_console;
  OpenJTalk *in_stack_000000f0;
  FILE *in_stack_000000f8;
  OpenJTalk *in_stack_00000100;
  OpenJTalk *in_stack_00000110;
  FILE *in_stack_000003b8;
  OpenJTalk *in_stack_000003c0;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  get_option((int)((ulong)in_RSI >> 0x20),
             (char **)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  iVar2 = fileno(_stdin);
  iVar2 = isatty(iVar2);
  bVar6 = iVar2 != 0;
  lVar3 = openjtalk_initialize(0,0);
  if (lVar3 == 0) {
    error_exit((char *)0x101ebd);
  }
  sVar4 = strlen(voice);
  if (sVar4 != 0) {
    if (voice[0] == '?') {
      print_voice_list(in_stack_00000110);
      goto LAB_001020a7;
    }
    bVar1 = openjtalk_setVoice(lVar3,voice);
    if ((bVar1 & 1) == 0) {
      fprintf(_stderr,"Voice \'%s\' not found.\n",voice);
      openjtalk_clear(lVar3);
      exit(1);
    }
  }
  sVar4 = strlen(message);
  if (sVar4 == 0) {
    sVar4 = strlen(outfile);
    if (sVar4 == 0) {
      sVar4 = strlen(infile);
      if (sVar4 == 0) {
        if ((bVar6 & 1) == 0) {
          speak_file(in_stack_000003c0,in_stack_000003b8);
        }
        else {
          speak_stdin_console(in_stack_000003c0);
        }
      }
      else {
        pFVar5 = fopen(infile,"r");
        if (pFVar5 == (FILE *)0x0) {
          openjtalk_clear(lVar3);
          exit(1);
        }
        speak_file(in_stack_000003c0,in_stack_000003b8);
      }
    }
    else {
      sVar4 = strlen(infile);
      if (sVar4 == 0) {
        if ((bVar6 & 1) == 0) {
          speak_file_to_file(in_stack_00000100,in_stack_000000f8);
        }
        else {
          speak_stdin_console_to_file(in_stack_000000f0);
        }
      }
      else {
        pFVar5 = fopen(infile,"r");
        if (pFVar5 == (FILE *)0x0) {
          openjtalk_clear(lVar3);
          exit(1);
        }
        speak_file_to_file(in_stack_00000100,in_stack_000000f8);
      }
    }
  }
  else {
    sVar4 = strlen(outfile);
    if (sVar4 == 0) {
      speak_commandline((OpenJTalk *)0x101f7a);
    }
    else {
      speak_commandline_to_file((OpenJTalk *)0x101f6e);
    }
  }
LAB_001020a7:
  openjtalk_clear();
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
	get_option(argc, argv);

#if defined(_WIN32)
	const bool stdin_console = _isatty(_fileno(stdin));
#else
	const bool stdin_console = isatty(fileno(stdin));
#endif

	OpenJTalk *openjtalk = openjtalk_initialize(NULL,NULL,NULL);
	if (openjtalk == NULL)
	{
		error_exit("OpenJTalk Initialization faileda.");
	}

	if (voice != NULL && strlen(voice)>0)
	{
		if (voice[0] == '?')
		{
			print_voice_list(openjtalk);
			goto exit_success;
		}
#if defined(_WIN32)
		bool res = openjtalk_setVoiceSjis(openjtalk, voice);
#else
		bool res = openjtalk_setVoice(openjtalk, voice);
#endif
		if (!res)
		{
			fprintf(stderr, "Voice '%s' not found.\n", voice);
			openjtalk_clear(openjtalk);
			exit(EXIT_FAILURE);
		}
	}

	if (message != NULL && strlen(message) > 0)
	{
		if (outfile != NULL && strlen(outfile) > 0)
		{
			speak_commandline_to_file(openjtalk);
		}
		else
		{
			speak_commandline(openjtalk);
		}
		goto exit_success;
	}

	if (outfile != NULL && strlen(outfile) > 0)
	{
		if (infile != NULL && strlen(infile) > 0)
		{
			FILE *fp = NULL;
			if ((fp = fopen(infile, "r")) == NULL)
			{
				openjtalk_clear(openjtalk);
				exit(EXIT_FAILURE);
			}
			speak_file_to_file(openjtalk, fp);
		}
		else
		{
			if (stdin_console)
			{
				speak_stdin_console_to_file(openjtalk);
			}
			else
			{
				speak_file_to_file(openjtalk, stdin);
			}
		}
		goto exit_success;
	}

	if (infile != NULL && strlen(infile) > 0)
	{
		FILE *fp = NULL;
		if ((fp = fopen(infile, "r")) == NULL)
		{
			openjtalk_clear(openjtalk);
			exit(EXIT_FAILURE);
		}
		speak_file(openjtalk, fp);
	}
	else
	{
		if (stdin_console)
		{
			speak_stdin_console(openjtalk);
		}
		else
		{
			speak_file(openjtalk, stdin);
		}
	}

exit_success:
	openjtalk_clear(openjtalk);
	exit(EXIT_SUCCESS);
}